

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void test_32(QPDF *pdf,char *arg2)

{
  size_t sVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  char *pcVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  QPDFWriter w;
  long *local_68 [2];
  long local_58 [2];
  QPDF *local_48;
  QPDFWriter local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  puVar3 = &DAT_00159730;
  uVar6 = 0;
  local_48 = pdf;
  do {
    pcVar4 = (char *)*puVar3;
    QPDFWriter::QPDFWriter(local_40,local_48,pcVar4);
    bVar5 = SUB81(local_40,0);
    QPDFWriter::setStaticID(bVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"file: ",6);
    sVar1 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,sVar1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"linearized: ",0xc);
    uVar7 = (ulong)((uint)uVar6 & 1);
    pcVar4 = "no";
    if ((uVar6 & 1) != 0) {
      pcVar4 = "yes";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,uVar7 + 2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"newline: ",9);
    pcVar4 = "yes";
    if (uVar6 < 2) {
      pcVar4 = "no";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,3 - (ulong)(uVar6 < 2));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    QPDFWriter::setLinearization(bVar5);
    if (uVar7 != 0) {
      QPDFWriter::setCompressStreams(bVar5);
    }
    pcVar4 = "%% Comment with newline\n";
    if (uVar6 < 2) {
      pcVar4 = "%% Comment\n% No newline";
    }
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,pcVar4,pcVar4 + (0x18 - (ulong)(uVar6 < 2)));
    QPDFWriter::setExtraHeaderText((string *)local_40);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
    QPDFWriter::write();
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    uVar6 = uVar6 + 1;
    puVar3 = puVar3 + 1;
  } while (uVar6 != 4);
  return;
}

Assistant:

static void
test_32(QPDF& pdf, char const* arg2)
{
    // Extra header text
    char const* filenames[] = {"a.pdf", "b.pdf", "c.pdf", "d.pdf"};
    for (int i = 0; i < 4; ++i) {
        bool linearized = ((i & 1) != 0);
        bool newline = ((i & 2) != 0);
        QPDFWriter w(pdf, filenames[i]);
        w.setStaticID(true);
        std::cout << "file: " << filenames[i] << std::endl
                  << "linearized: " << (linearized ? "yes" : "no") << std::endl
                  << "newline: " << (newline ? "yes" : "no") << std::endl;
        w.setLinearization(linearized);
        if (linearized) {
            w.setCompressStreams(false); // avoid dependency on zlib's output
        }
        w.setExtraHeaderText(newline ? "%% Comment with newline\n" : "%% Comment\n% No newline");
        w.write();
    }
}